

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O1

SmartPointer<GEO::ThreadManager> * __thiscall
GEO::SmartPointer<GEO::ThreadManager>::operator=
          (SmartPointer<GEO::ThreadManager> *this,ThreadManager *ptr)

{
  int *piVar1;
  ThreadManager *pTVar2;
  
  pTVar2 = this->pointer_;
  if (pTVar2 != ptr) {
    if (pTVar2 != (ThreadManager *)0x0) {
      piVar1 = &(pTVar2->super_Counted).nb_refs_;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(pTVar2->super_Counted)._vptr_Counted[1])();
      }
    }
    this->pointer_ = ptr;
    if (ptr != (ThreadManager *)0x0) {
      piVar1 = &(ptr->super_Counted).nb_refs_;
      *piVar1 = *piVar1 + 1;
    }
  }
  return this;
}

Assistant:

SmartPointer<T>& operator= (T* ptr) {
            if(ptr != pointer_) {
                T::unref(pointer_);
                pointer_ = ptr;
                T::ref(pointer_);
            }
            return *this;
        }